

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsv.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ssize_t sVar6;
  int *piVar7;
  char *x4;
  int p1;
  int extraout_EDX;
  int p1_00;
  int extraout_EDX_00;
  char *x5;
  char *x6;
  bool bVar8;
  strerr *se;
  char ch;
  int wstat;
  iopause_fd x [3];
  stat s;
  taia now;
  taia deadline;
  char buf [256];
  
  progname = *argv;
  if ((argv[1] == (char *)0x0) || (argv[2] != (char *)0x0)) {
    strerr_die(1,"usage: ",progname," dir","\n",(char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  dir = argv[1];
  iVar3 = pipe(selfpipe);
  if (iVar3 == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to create selfpipe",": ",(char *)0x0,
               &strerr_sys);
  }
  coe(selfpipe[0]);
  coe(selfpipe[1]);
  ndelay_on(selfpipe[0]);
  ndelay_on(selfpipe[1]);
  sig_block(sig_child);
  sig_catch(sig_child,s_child);
  sig_block(sig_term);
  sig_catch(sig_term,s_term);
  iVar3 = chdir(dir);
  if (iVar3 == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to change to directory",": ",(char *)0x0,
               &strerr_sys);
  }
  svd[0].islog = 0;
  svd[1].pid = 0;
  svd[0].pid = 0;
  svd[0].state = 0;
  svd[0].ctrl = 0;
  svd[0].want = 0;
  taia_now(&svd[0].start);
  iVar3 = stat("down",(stat *)&s);
  if (iVar3 != -1) {
    svd[0].want = 1;
  }
  iVar3 = stat("log",(stat *)&s);
  if (iVar3 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 == error_noent) goto LAB_001033de;
    x4 = "unable to stat() ./log: ";
    x5 = ": ";
    x6 = (char *)0x0;
    se = &strerr_sys;
  }
  else {
    if ((s.st_mode & 0xf000) == 0x4000) {
      haslog = 1;
      svd[1].state = 0;
      svd[1].ctrl = 0;
      svd[1].want = 0;
      svd[1].islog = 1;
      taia_now(&svd[1].start);
      iVar3 = stat("log/down",(stat *)&s);
      if (iVar3 != -1) {
        svd[1].want = 1;
      }
      iVar3 = pipe(logpipe);
      if (iVar3 == -1) {
        strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to create log pipe",": ",(char *)0x0,
                   &strerr_sys);
      }
      coe(logpipe[0]);
      coe(logpipe[1]);
      goto LAB_001033de;
    }
    x4 = "./log";
    x6 = ": not a directory.";
    x5 = (char *)0x0;
    se = (strerr *)0x0;
  }
  strerr_warn("runsv ",dir,": warning: ",x4,x5,x6,se);
LAB_001033de:
  iVar3 = mkdir("supervise",0x1c0);
  if (iVar3 == -1) {
    sVar6 = readlink("supervise",buf,0x100);
    iVar3 = (int)sVar6;
    if (iVar3 == -1) {
      piVar5 = __errno_location();
      if ((*piVar5 != 2) && (*piVar5 != 0x16)) {
        strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to readlink ./supervise",": ",(char *)0x0,
                   &strerr_sys);
      }
    }
    else {
      if (iVar3 == 0x100) {
        strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to readlink ./supervise: ","name too long",
                   (char *)0x0,(strerr *)0x0);
      }
      buf[iVar3] = '\0';
      mkdir(buf,0x1c0);
    }
  }
  svd[0].fdlock = open_append("supervise/lock");
  if (svd[0].fdlock == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to open supervise/lock",": ",(char *)0x0,
               &strerr_sys);
  }
  iVar3 = lock_exnb(svd[0].fdlock);
  if (iVar3 == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to lock supervise/lock",": ",(char *)0x0,
               &strerr_sys);
  }
  coe(svd[0].fdlock);
  if (haslog != 0) {
    iVar3 = mkdir("log/supervise",0x1c0);
    if (iVar3 == -1) {
      sVar6 = readlink("log/supervise",buf,0x100);
      iVar3 = (int)sVar6;
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        if ((*piVar5 != 2) && (*piVar5 != 0x16)) {
          strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to readlink ./log/supervise",": ",
                     (char *)0x0,&strerr_sys);
        }
      }
      else {
        if (iVar3 == 0x100) {
          strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to readlink ./log/supervise: ",
                     "name too long",(char *)0x0,(strerr *)0x0);
        }
        buf[iVar3] = '\0';
        iVar3 = open_read(".");
        if (iVar3 == -1) {
          strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to open current directory",": ",
                     (char *)0x0,&strerr_sys);
        }
        iVar4 = chdir("./log");
        if (iVar4 == -1) {
          strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to change directory to ./log",": ",
                     (char *)0x0,&strerr_sys);
        }
        mkdir(buf,0x1c0);
        iVar4 = fchdir(iVar3);
        if (iVar4 == -1) {
          strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to change back to service directory",": "
                     ,(char *)0x0,&strerr_sys);
        }
        close(iVar3);
      }
    }
    svd[1].fdlock = open_append("log/supervise/lock");
    if (svd[1].fdlock == -1) {
      strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to open log/supervise/lock",": ",(char *)0x0,
                 &strerr_sys);
    }
    iVar3 = lock_ex(svd[1].fdlock);
    if (iVar3 == -1) {
      strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to lock log/supervise/lock",": ",(char *)0x0,
                 &strerr_sys);
    }
    coe(svd[1].fdlock);
  }
  fifo_make("supervise/control",0x180);
  iVar3 = stat("supervise/control",(stat *)&s);
  if (iVar3 == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to stat supervise/control",": ",(char *)0x0,
               &strerr_sys);
  }
  if ((s.st_mode & 0xf000) != 0x1000) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","supervise/control exists but is not a fifo","",
               (char *)0x0,(strerr *)0x0);
  }
  svd[0].fdcontrol = open_read("supervise/control");
  if (svd[0].fdcontrol == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to open supervise/control",": ",(char *)0x0,
               &strerr_sys);
  }
  coe(svd[0].fdcontrol);
  svd[0].fdcontrolwrite = open_write("supervise/control");
  if (svd[0].fdcontrolwrite == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to open supervise/control",": ",(char *)0x0,
               &strerr_sys);
  }
  coe(svd[0].fdcontrolwrite);
  update_status(svd);
  if (haslog != 0) {
    fifo_make("log/supervise/control",0x180);
    iVar3 = stat("supervise/control",(stat *)&s);
    if (iVar3 == -1) {
      strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to stat log/supervise/control",": ",
                 (char *)0x0,&strerr_sys);
    }
    if ((s.st_mode & 0xf000) != 0x1000) {
      strerr_die(0x6f,"runsv ",dir,": fatal: ","log/supervise/control exists but is not a fifo","",
                 (char *)0x0,(strerr *)0x0);
    }
    svd[1].fdcontrol = open_read("log/supervise/control");
    if (svd[1].fdcontrol == -1) {
      strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to open log/supervise/control",": ",
                 (char *)0x0,&strerr_sys);
    }
    coe(svd[1].fdcontrol);
    svd[1].fdcontrolwrite = open_write("log/supervise/control");
    if (svd[1].fdcontrolwrite == -1) {
      strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to open log/supervise/control",": ",
                 (char *)0x0,&strerr_sys);
    }
    coe(svd[1].fdcontrolwrite);
    update_status(svd + 1);
  }
  fifo_make("supervise/ok",0x180);
  iVar3 = open_read("supervise/ok");
  if (iVar3 == -1) {
    strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to read supervise/ok",": ",(char *)0x0,
               &strerr_sys);
  }
  coe(iVar3);
  if (haslog != 0) {
    fifo_make("log/supervise/ok",0x180);
    iVar3 = open_read("log/supervise/ok");
    if (iVar3 == -1) {
      strerr_die(0x6f,"runsv ",dir,": fatal: ","unable to read log/supervise/ok",": ",(char *)0x0,
                 &strerr_sys);
    }
    coe(iVar3);
  }
LAB_00103b4d:
  if ((haslog != 0) && (svd[1].want == 0 && svd[1].pid == 0)) {
    startservice(svd + 1);
  }
  if ((svd[0].pid == 0) && ((svd[0].want == 0 || (svd[0].state == 2)))) {
    startservice(svd);
  }
  x[0].fd = selfpipe[0];
  x[0].events = 1;
  x[1].fd = svd[0].fdcontrol;
  x[1].events = 1;
  if (haslog != 0) {
    x[2].fd = svd[1].fdcontrol;
    x[2].events = 1;
  }
  piVar5 = (int *)&now;
  taia_now((taia *)piVar5);
  taia_uint(&deadline,0xe10);
  taia_add(&deadline,(taia *)piVar5,&deadline);
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  iopause(x,haslog + 2,&deadline,(taia *)piVar5);
  sig_block(sig_term);
  sig_block(sig_child);
  do {
    sVar6 = read(selfpipe[0],&ch,1);
  } while (sVar6 == 1);
LAB_00103da1:
  iVar3 = wait_nohang(&wstat);
  if (iVar3 == -1) {
    piVar7 = __errno_location();
    piVar5 = &error_intr;
    if (*piVar7 != error_intr) goto LAB_00103dd2;
  }
  else if (iVar3 == 0) goto LAB_00103dd2;
  uVar1 = svd[0]._0_8_;
  if (iVar3 == svd[0].pid) {
    svd[0]._0_8_ = svd[0]._0_8_ & 0xffffffff00000000;
    uVar2 = svd[0]._0_8_;
    svd[0].wstat = wstat;
    svd[0]._8_8_ = svd[0]._8_8_ & 0xfffffffffffffffe;
    pidchanged = 1;
    svd[0].state = SUB84(uVar1,4);
    bVar8 = svd[0].state == 2;
    svd[0]._0_8_ = uVar2;
    if ((bVar8) || (iVar4 = open_read("finish"), iVar4 == -1)) {
      svd[0]._0_8_ = svd[0]._0_8_ & 0xffffffff;
      taia_uint(&deadline,1);
      taia_add(&deadline,&svd[0].start,&deadline);
      taia_now(&svd[0].start);
      update_status(svd);
      iVar4 = taia_less(&svd[0].start,&deadline);
      if (iVar4 != 0) {
        sleep(1);
      }
      goto LAB_00103d2c;
    }
    close(iVar4);
    svd[0].state = 2;
    update_status(svd);
  }
  else {
LAB_00103d2c:
    if ((haslog != 0) && (iVar3 == svd[1].pid)) {
      svd[1].pid = 0;
      svd[1].state = 0;
      pidchanged = 1;
      svd[1].ctrl = svd[1].ctrl & 0xfffffffe;
      taia_uint(&deadline,1);
      taia_add(&deadline,&svd[1].start,&deadline);
      taia_now(&svd[1].start);
      update_status(svd + 1);
      iVar3 = taia_less(&svd[1].start,&deadline);
      if (iVar3 != 0) {
        sleep(1);
      }
    }
  }
  goto LAB_00103da1;
LAB_00103dd2:
  sVar6 = read(svd[0].fdcontrol,&ch,1);
  iVar3 = p1;
  if (sVar6 == 1) {
    ctrl((EVP_PKEY_CTX *)svd,(int)ch,p1,piVar5);
    iVar3 = extraout_EDX;
  }
  if ((haslog != 0) && (sVar6 = read(svd[1].fdcontrol,&ch,1), iVar3 = p1_00, sVar6 == 1)) {
    ctrl((EVP_PKEY_CTX *)(svd + 1),(int)ch,p1_00,piVar5);
    iVar3 = extraout_EDX_00;
  }
  if (sigterm != 0) {
    ctrl((EVP_PKEY_CTX *)svd,0x78,iVar3,piVar5);
    sigterm = 0;
  }
  if ((svd[0].want == 2) && (svd[0].state == 0)) {
    if (svd[1].pid == 0) {
      _exit(0);
    }
    if (svd[1].want != 2) {
      svd[1].want = 2;
      update_status(svd + 1);
      iVar3 = close(logpipe[1]);
      if (iVar3 == -1) {
        strerr_warn("runsv ",dir,": warning: ","unable to close logpipe[1]",": ",(char *)0x0,
                    &strerr_sys);
      }
      iVar3 = close(logpipe[0]);
      if (iVar3 == -1) {
        strerr_warn("runsv ",dir,": warning: ","unable to close logpipe[0]",": ",(char *)0x0,
                    &strerr_sys);
      }
    }
  }
  goto LAB_00103b4d;
}

Assistant:

int main(int argc, char **argv) {
  struct stat s;
  int fd;
  int r;
  char buf[256];

  progname =argv[0];
  if (! argv[1] || argv[2]) usage();
  dir =argv[1];

  if (pipe(selfpipe) == -1) fatal("unable to create selfpipe");
  coe(selfpipe[0]);
  coe(selfpipe[1]);
  ndelay_on(selfpipe[0]);
  ndelay_on(selfpipe[1]);

  sig_block(sig_child);
  sig_catch(sig_child, s_child);
  sig_block(sig_term);
  sig_catch(sig_term, s_term);

  if (chdir(dir) == -1) fatal("unable to change to directory");
  svd[0].pid =0;
  svd[0].state =S_DOWN;
  svd[0].ctrl =C_NOOP;
  svd[0].want =W_UP;
  svd[0].islog =0;
  svd[1].pid =0;
  taia_now(&svd[0].start);
  if (stat("down", &s) != -1) svd[0].want =W_DOWN;

  if (stat("log", &s) == -1) {
    if (errno != error_noent)
      warn("unable to stat() ./log: ");
  }
  else {
    if (! S_ISDIR(s.st_mode))
      warnx("./log", 0, ": not a directory.");
    else {
      haslog =1;
      svd[1].state =S_DOWN;
      svd[1].ctrl =C_NOOP;
      svd[1].want =W_UP;
      svd[1].islog =1;
      taia_now(&svd[1].start);
      if (stat("log/down", &s) != -1)
        svd[1].want =W_DOWN;
      if (pipe(logpipe) == -1)
        fatal("unable to create log pipe");
      coe(logpipe[0]);
      coe(logpipe[1]);
    }
  }

  if (mkdir("supervise", 0700) == -1) {
    if ((r =readlink("supervise", buf, 256)) != -1) {
      if (r == 256)
        fatalx("unable to readlink ./supervise: ", "name too long");
      buf[r] =0;
      mkdir(buf, 0700);
    }
    else {
      if ((errno != ENOENT) && (errno != EINVAL))
        fatal("unable to readlink ./supervise");
    }
  }
  if ((svd[0].fdlock =open_append("supervise/lock")) == -1)
    fatal("unable to open supervise/lock");
  if (lock_exnb(svd[0].fdlock) == -1) fatal("unable to lock supervise/lock");
  coe(svd[0].fdlock);
  if (haslog) {
    if (mkdir("log/supervise", 0700) == -1) {
      if ((r =readlink("log/supervise", buf, 256)) != -1) {
        if (r == 256)
          fatalx("unable to readlink ./log/supervise: ", "name too long");
        buf[r] =0;
        if ((fd =open_read(".")) == -1)
          fatal("unable to open current directory");
        if (chdir("./log") == -1)
          fatal("unable to change directory to ./log");
        mkdir(buf, 0700);
        if (fchdir(fd) == -1)
          fatal("unable to change back to service directory");
        close(fd);
      }
      else {
        if ((errno != ENOENT) && (errno != EINVAL))
          fatal("unable to readlink ./log/supervise");
      }
    }
    if ((svd[1].fdlock =open_append("log/supervise/lock")) == -1)
      fatal("unable to open log/supervise/lock");
    if (lock_ex(svd[1].fdlock) == -1)
      fatal("unable to lock log/supervise/lock");
    coe(svd[1].fdlock);
  }

  fifo_make("supervise/control", 0600);
  if (stat("supervise/control", &s) == -1)
    fatal("unable to stat supervise/control");
  if (!S_ISFIFO(s.st_mode))
    fatalx("supervise/control exists but is not a fifo", "");
  if ((svd[0].fdcontrol =open_read("supervise/control")) == -1)
    fatal("unable to open supervise/control");
  coe(svd[0].fdcontrol);
  if ((svd[0].fdcontrolwrite =open_write("supervise/control")) == -1)
    fatal("unable to open supervise/control");
  coe(svd[0].fdcontrolwrite);
  update_status(&svd[0]);
  if (haslog) {
    fifo_make("log/supervise/control", 0600);
    if (stat("supervise/control", &s) == -1)
      fatal("unable to stat log/supervise/control");
    if (!S_ISFIFO(s.st_mode))
      fatalx("log/supervise/control exists but is not a fifo", "");
    if ((svd[1].fdcontrol =open_read("log/supervise/control")) == -1)
      fatal("unable to open log/supervise/control");
    coe(svd[1].fdcontrol);
    if ((svd[1].fdcontrolwrite =open_write("log/supervise/control")) == -1)
      fatal("unable to open log/supervise/control");
    coe(svd[1].fdcontrolwrite);
    update_status(&svd[1]);
  }
  fifo_make("supervise/ok",0600);
  if ((fd =open_read("supervise/ok")) == -1)
    fatal("unable to read supervise/ok");
  coe(fd);
  if (haslog) {
    fifo_make("log/supervise/ok",0600);
    if ((fd =open_read("log/supervise/ok")) == -1)
      fatal("unable to read log/supervise/ok");
    coe(fd);
  }
  for (;;) {
    iopause_fd x[3];
    struct taia deadline;
    struct taia now;
    char ch;

    if (haslog)
      if (! svd[1].pid && (svd[1].want == W_UP)) startservice(&svd[1]);
    if (! svd[0].pid)
      if ((svd[0].want == W_UP) || (svd[0].state == S_FINISH))
        startservice(&svd[0]);

    x[0].fd =selfpipe[0];
    x[0].events =IOPAUSE_READ;
    x[1].fd =svd[0].fdcontrol;
    x[1].events =IOPAUSE_READ;
    if (haslog) {
      x[2].fd =svd[1].fdcontrol;
      x[2].events =IOPAUSE_READ;
    }
    taia_now(&now);
    taia_uint(&deadline, 3600);
    taia_add(&deadline, &now, &deadline);

    sig_unblock(sig_term);
    sig_unblock(sig_child);
    iopause(x, 2 +haslog, &deadline, &now);
    sig_block(sig_term);
    sig_block(sig_child);

    while (read(selfpipe[0], &ch, 1) == 1)
      ;
    for (;;) {
      int child;
      int wstat;

      child =wait_nohang(&wstat);
      if (!child) break;
      if ((child == -1) && (errno != error_intr)) break;
      if (child == svd[0].pid) {
        svd[0].pid =0;
        pidchanged =1;
        svd[0].wstat =wstat;
        svd[0].ctrl &=~C_TERM;
        if (svd[0].state != S_FINISH)
          if ((fd =open_read("finish")) != -1) {
            close(fd);
            svd[0].state =S_FINISH;
            update_status(&svd[0]);
            continue;
          }
        svd[0].state =S_DOWN;
        taia_uint(&deadline, 1);
        taia_add(&deadline, &svd[0].start, &deadline);
        taia_now(&svd[0].start);
        update_status(&svd[0]);
        if (taia_less(&svd[0].start, &deadline)) sleep(1);
      }
      if (haslog) {
        if (child == svd[1].pid) {
          svd[1].pid =0;
          pidchanged =1;
          svd[1].state =S_DOWN;
          svd[1].ctrl &=~C_TERM;
          taia_uint(&deadline, 1);
          taia_add(&deadline, &svd[1].start, &deadline);
          taia_now(&svd[1].start);
          update_status(&svd[1]);
          if (taia_less(&svd[1].start, &deadline)) sleep(1);
        }
      }
    }
    if (read(svd[0].fdcontrol, &ch, 1) == 1) ctrl(&svd[0], ch);
    if (haslog)
      if (read(svd[1].fdcontrol, &ch, 1) == 1) ctrl(&svd[1], ch);

    if (sigterm) { ctrl(&svd[0], 'x'); sigterm =0; }

    if ((svd[0].want == W_EXIT) && (svd[0].state == S_DOWN)) {
      if (svd[1].pid == 0) _exit(0);
      if (svd[1].want != W_EXIT) {
        svd[1].want =W_EXIT;
        /* stopservice(&svd[1]); */
        update_status(&svd[1]);
        if (close(logpipe[1]) == -1) warn("unable to close logpipe[1]");
        if (close(logpipe[0]) == -1) warn("unable to close logpipe[0]");
      }
    }
  }
  _exit(0);
}